

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.h
# Opt level: O3

void __thiscall
gimage::Histogram::Histogram<unsigned_short>
          (Histogram *this,Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *image1,
          Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *image2,int binsize)

{
  int iVar1;
  int iVar2;
  int iVar3;
  unsigned_short ***pppuVar4;
  unsigned_short ***pppuVar5;
  unsigned_long **ppuVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  
  this->bs = 0;
  this->w = 0;
  this->h = 0;
  this->val = (unsigned_long *)0x0;
  this->row = (unsigned_long **)0x0;
  lVar15 = image1->n;
  uVar9 = 0;
  lVar10 = -lVar15;
  if (0 < lVar15) {
    lVar10 = lVar15;
  }
  uVar8 = 0;
  if (lVar15 != 0) {
    lVar15 = 0;
    uVar8 = 0;
    do {
      uVar12 = uVar8;
      uVar8 = (uint)image1->pixel[lVar15];
      if (image1->pixel[lVar15] < uVar12) {
        uVar8 = uVar12;
      }
      lVar15 = lVar15 + 1;
    } while (lVar10 != lVar15);
    if (0xffff < uVar12) {
      uVar8 = 0x10000;
    }
  }
  if (uVar8 < 0x101) {
    uVar8 = 0x100;
  }
  lVar15 = image2->n;
  lVar10 = -lVar15;
  if (0 < lVar15) {
    lVar10 = lVar15;
  }
  if (lVar15 != 0) {
    lVar15 = 0;
    uVar9 = 0;
    do {
      uVar12 = uVar9;
      uVar9 = (uint)image2->pixel[lVar15];
      if (image2->pixel[lVar15] < uVar12) {
        uVar9 = uVar12;
      }
      lVar15 = lVar15 + 1;
    } while (lVar10 != lVar15);
    if (0xffff < uVar12) {
      uVar9 = 0x10000;
    }
  }
  uVar12 = 0x100;
  if (0x100 < uVar9) {
    uVar12 = uVar9;
  }
  setSize(this,(int)uVar8 / binsize,(int)uVar12 / binsize,binsize);
  uVar9 = this->h * this->w;
  if (0 < (int)uVar9) {
    memset(this->val,0,(ulong)uVar9 << 3);
  }
  lVar15 = image1->height;
  lVar10 = image2->height;
  if (0 < lVar10 && 0 < lVar15) {
    iVar1 = image1->depth;
    lVar11 = image1->width;
    lVar13 = image2->width;
    lVar16 = 0;
    do {
      if ((0 < lVar11) && (0 < lVar13)) {
        pppuVar4 = image1->img;
        iVar2 = this->w;
        iVar14 = image2->depth;
        lVar15 = 0;
        do {
          if ((0 < iVar1) && (0 < iVar14)) {
            pppuVar5 = image2->img;
            iVar3 = this->h;
            ppuVar6 = this->row;
            lVar10 = 1;
            do {
              if (((int)(uint)pppuVar4[lVar10 + -1][lVar16][lVar15] < (iVar2 + 1) * binsize + -1) &&
                 ((int)(uint)pppuVar5[lVar10 + -1][lVar16][lVar15] < (iVar3 + 1) * binsize + -1)) {
                ppuVar6[(int)((long)(ulong)pppuVar5[lVar10 + -1][lVar16][lVar15] / (long)binsize)]
                [(int)((long)(ulong)pppuVar4[lVar10 + -1][lVar16][lVar15] / (long)binsize)] =
                     ppuVar6[(int)((long)(ulong)pppuVar5[lVar10 + -1][lVar16][lVar15] /
                                  (long)binsize)]
                     [(int)((long)(ulong)pppuVar4[lVar10 + -1][lVar16][lVar15] / (long)binsize)] + 1
                ;
                iVar14 = image2->depth;
              }
            } while ((lVar10 < iVar1) && (bVar7 = lVar10 < iVar14, lVar10 = lVar10 + 1, bVar7));
            lVar11 = image1->width;
            lVar13 = image2->width;
          }
          lVar15 = lVar15 + 1;
        } while ((lVar15 < lVar11) && (lVar15 < lVar13));
        lVar15 = image1->height;
        lVar10 = image2->height;
      }
      lVar16 = lVar16 + 1;
    } while ((lVar16 < lVar15) && (lVar16 < lVar10));
  }
  return;
}

Assistant:

Histogram(const Image<T> &image1, const Image<T> &image2, int binsize=1)
    {
      w=h=bs=0;
      val=0;
      row=0;

      int width=std::max(256, std::min(65536, static_cast<int>(image1.maxValue())))/binsize;
      int height=std::max(256, std::min(65536, static_cast<int>(image2.maxValue())))/binsize;
      setSize(width, height, binsize);
      clear();

      for (int k=0; k<image1.getHeight() && k < image2.getHeight(); k++)
      {
        for (int i=0; i<image1.getWidth() && i < image2.getWidth(); i++)
        {
          if (image1.isValid(i, k) && image2.isValid(i, k))
          {
            for (int d=0; d<image1.getDepth() && d < image2.getDepth(); d++)
            {
              T v1=image1.get(i, k, d);
              T v2=image2.get(i, k, d);

              if (v1 < w*binsize+binsize-1 && v2 < h*binsize+binsize-1)
              {
                row[static_cast<int>(v2)/binsize][static_cast<int>(v1)/binsize]++;
              }
            }
          }
        }
      }
    }